

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

token_t * get_token(void)

{
  char cVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  ushort **ppuVar11;
  ushort *puVar12;
  long __off;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  uint uVar17;
  int bc;
  int iVar18;
  int *piVar19;
  int bl;
  undefined4 local_43c;
  char local_438 [1032];
  
  do {
    readbyte();
    ppuVar11 = __ctype_b_loc();
    iVar10 = 0x31;
    while (iVar18 = iVar10, uVar7 = column, uVar17 = line, iVar18 != 0) {
      while ((*(byte *)((long)*ppuVar11 + (long)c * 2 + 1) & 0x20) != 0) {
        readbyte();
      }
      iVar10 = 0;
      if ((c == 0x2f) && ((l == 0x2f || (l == 0x2a)))) {
        eline = line;
        ecolumn = column;
        readbyte();
        iVar10 = iVar18;
        if (c == 0x2a) {
          do {
            readbyte();
            if (c == -1) {
              err(E,"unterminated comment");
              break;
            }
          } while ((c != 0x2a) || (l != 0x2f));
          readbyte();
          readbyte();
        }
        else {
          do {
            readbyte();
          } while (c != 10);
        }
      }
    }
    eline = line;
    ecolumn = column;
    t.id = c;
    t.line = line;
    t.column = column;
    if (((long)c == 0x23) && (prev == 10)) {
      puVar12 = *ppuVar11;
      if ((*(byte *)((long)puVar12 + (long)l * 2 + 1) & 0x20) != 0) {
        pcVar13 = pp_get_token();
        pcVar16 = pcVar13;
        uVar17 = line;
        if (pcVar13 != (char *)0x0) goto LAB_001043f6;
        goto LAB_001047de;
      }
    }
    else {
      if (c == -1) goto switchD_00104170_caseD_25;
      puVar12 = *ppuVar11;
    }
    if ((c == 0x5f) || ((puVar12[c] & 0x400) != 0)) {
      t.id = 0x86;
      t.string[0] = (char)c;
      uVar17 = 1;
      pcVar16 = t.string + 1;
      while (((long)l == 0x5f || (((*ppuVar11)[l] & 8) != 0))) {
        readbyte();
        if (uVar17 < 0x1f) {
          *pcVar16 = (char)c;
          pcVar16 = pcVar16 + 1;
          uVar17 = uVar17 + 1;
        }
      }
      *pcVar16 = '\0';
      if (0x1e < uVar17) {
        err(W,"too long identifier has been truncated to %d characters.",0x1f);
      }
      iVar10 = bcmp(t.string,"byte",5);
      if (iVar10 == 0) {
        t.id = 0x80;
      }
      else {
        iVar10 = bcmp(t.string,"return",7);
        if (iVar10 == 0) {
          t.id = 0x83;
        }
        else {
          iVar10 = bcmp(t.string,"void",5);
          if (iVar10 == 0) {
            t.id = 0x84;
          }
          else {
            iVar10 = bcmp(t.string,"word",5);
            if (iVar10 == 0) {
              t.id = 0x85;
            }
          }
        }
      }
      goto switchD_00104170_caseD_25;
    }
    if ((puVar12[c] >> 0xb & 1) != 0) {
      t.id = 0x87;
      t._unsigned = 0;
      t._word = 0;
      if (c == 0x30) {
        t.constant = 0;
        if ((l & 0xffffffdfU) == 0x58) {
          __off = ftell((FILE *)f);
          readbyte();
          iVar10 = 0x10;
          if ((((*ppuVar11)[l] >> 0xb & 1) == 0) &&
             ((0x25 < l - 0x41U || ((0x3f0000003fU >> ((ulong)(l - 0x41U) & 0x3f) & 1) == 0)))) {
            fseek((FILE *)f,__off,0);
            l = c;
            line = uVar17;
            column = uVar7;
          }
        }
        else {
          iVar10 = 8;
          line = uVar17;
          column = uVar7;
        }
      }
      else {
        t.constant = c - 0x30;
        iVar10 = 10;
        line = uVar17;
        column = uVar7;
      }
      uVar17 = 1;
      bVar6 = false;
      bVar5 = false;
      goto LAB_00104474;
    }
    switch(c) {
    case 0x21:
      goto switchD_00104170_caseD_21;
    case 0x25:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2f:
    case 0x3b:
      goto switchD_00104170_caseD_25;
    case 0x3c:
      if (l == 0x3d) {
        readbyte();
        t.id = 0x8a;
      }
      goto switchD_00104170_caseD_25;
    case 0x3d:
      if (l == 0x3d) {
        readbyte();
        t.id = 0x88;
      }
      goto switchD_00104170_caseD_25;
    case 0x3e:
      if (l == 0x3d) {
        readbyte();
        t.id = 0x8b;
      }
      goto switchD_00104170_caseD_25;
    default:
      if ((c - 0x5bU < 0x23) && ((0x500000005U >> ((ulong)(c - 0x5bU) & 0x3f) & 1) != 0))
      goto switchD_00104170_caseD_25;
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x26:
    case 0x27:
    case 0x2e:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
      pcVar16 = "stray \"%c\" in program";
      if (c - 0x7fU < 0xffffffa1) {
        pcVar16 = "stray \'%o\' in program";
      }
      err(E,pcVar16);
    }
  } while( true );
switchD_00104170_caseD_21:
  if (l == 0x3d) {
    readbyte();
    t.id = 0x89;
  }
  goto switchD_00104170_caseD_25;
LAB_00104474:
  uVar2 = (*ppuVar11)[l];
  if (iVar10 == 0x10) {
    iVar18 = -0x30;
    if ((((uVar2 >> 0xb & 1) == 0) && (iVar18 = -0x57, 5 < l - 0x61U)) &&
       (iVar18 = -0x37, 5 < l - 0x41U)) goto LAB_00104567;
LAB_001044bf:
    readbyte();
    iVar18 = iVar18 + c;
    if (iVar18 == -1) goto LAB_00104567;
  }
  else {
    if (iVar10 == 10) {
      iVar18 = -0x30;
      if ((uVar2 >> 0xb & 1) != 0) goto LAB_001044bf;
      goto LAB_00104567;
    }
    if ((uVar2 >> 0xb & 1) == 0) goto LAB_00104567;
    readbyte();
    iVar18 = eline;
    if ((c & 0xfffffff8U) != 0x30) {
      local_43c = ecolumn;
      err(E,"invalid digit \"%c\" in octal constant",(ulong)(uint)c);
      ecolumn = local_43c;
      eline = iVar18;
LAB_00104567:
      if (((long)l == 0x5f) || (((*ppuVar11)[l] & 0x400) != 0)) {
        readbyte();
        pcVar16 = local_438 + 1;
        local_438[0] = (char)c;
        while (((*ppuVar11)[l] & 8) != 0) {
          readbyte();
          if (uVar17 < 8) {
            *pcVar16 = (char)c;
            pcVar16 = pcVar16 + 1;
            uVar17 = uVar17 + 1;
          }
        }
        *pcVar16 = '\0';
        bVar4 = false;
        pcVar16 = local_438;
        bVar3 = false;
        do {
          cVar1 = *pcVar16;
          if ((cVar1 == 'U') || (cVar1 == 'u')) {
            piVar19 = &t._unsigned;
            bVar8 = bVar3;
            bVar9 = true;
            if (bVar4) goto LAB_0010467c;
          }
          else {
            if (cVar1 != 'w') {
              if (cVar1 == '\0') break;
              if (cVar1 != 'W') goto LAB_0010467c;
            }
            piVar19 = &t._word;
            bVar8 = true;
            bVar9 = bVar4;
            if (bVar3) goto LAB_0010467c;
          }
          bVar4 = bVar9;
          bVar3 = bVar8;
          *piVar19 = 1;
          pcVar16 = pcVar16 + 1;
        } while( true );
      }
      if (t._word == 0) {
        if (0x7f < t.constant && t._unsigned == 0) {
          t._unsigned = 1;
          t._word = 0;
        }
        if (!bVar5) goto switchD_00104170_caseD_25;
        t.constant = t.constant & 0xff;
      }
      else {
        if (0x7fff < t.constant && t._unsigned == 0) {
          t._unsigned = 1;
        }
        if (!bVar6) goto switchD_00104170_caseD_25;
        t.constant = t.constant & 0xffff;
      }
      t._unsigned = 1;
      err(W,"numeric constant is too large for its type");
      goto switchD_00104170_caseD_25;
    }
    iVar18 = c + -0x30;
  }
  t.constant = t.constant * iVar10 + iVar18;
  if (0xff < t.constant) {
    bVar5 = true;
  }
  if (0xffff < t.constant) {
    bVar6 = true;
  }
  goto LAB_00104474;
LAB_0010467c:
  pcVar16 = "";
  if (uVar17 == 8) {
    pcVar16 = "...";
  }
  err(E,"invalid suffix \"%s%s\" after integer constant",local_438,pcVar16);
  goto switchD_00104170_caseD_25;
  while (pcVar16 = pcVar16 + 1, (*(byte *)((long)*ppuVar11 + (long)cVar1 * 2 + 1) & 8) != 0) {
LAB_001043f6:
    cVar1 = *pcVar16;
    if ((long)cVar1 == 0) {
      iVar10 = atoi(pcVar13);
      uVar17 = iVar10 - 1;
      pcVar13 = pp_get_token();
      pcVar16 = pcVar13;
      if (pcVar13 != (char *)0x0) {
        do {
          pcVar14 = pcVar16;
          pcVar16 = pcVar14 + 1;
        } while (*pcVar14 != '\0');
        if ((*pcVar13 == '\"') && (pcVar14[-1] == '\"')) {
          strcpy(local_438,pcVar13 + 1);
          sVar15 = strlen(pcVar13 + 1);
          local_438[sVar15 - 1] = '\0';
          pcVar16 = pp_get_token();
          if (pcVar16 == (char *)0x0) {
            esetfile(local_438);
          }
          else {
            err(E,"unexpected flag \"%s\" in line directive",pcVar16);
            while ((l != -1 && (l != 10))) {
              readbyte();
            }
            line = uVar17;
            esetfile(local_438);
            uVar17 = line;
          }
        }
        else {
          err(E,"\"%s\" is not a valid filename",pcVar13);
          while ((l != -1 && (l != 10))) {
            readbyte();
          }
        }
      }
      goto LAB_001047de;
    }
  }
  while ((l != -1 && (l != 10))) {
    readbyte();
  }
  err(E,"invalid line number \"%s\"",pcVar13);
  uVar17 = line;
LAB_001047de:
  line = uVar17;
  get_token();
switchD_00104170_caseD_25:
  return &t;
}

Assistant:

token_t* get_token()
{
    int skip = '1';

    readbyte();

    while (skip)
    {
        while (isspace(c))
            readbyte();

        if (c == '/' && (l == '*' || l == '/'))
        {
            eline = line;
            ecolumn = column;

            readbyte();
            if (c == '*')
            {
                do
                {
                    readbyte();
                    if (c == EOF)
                    {
                        err(E, "unterminated comment");
                        break;
                    }
                } while (!(c == '*' && l == '/'));
                readbyte();
                readbyte();
            }
            else
            {
                do
                {
                    readbyte();
                } while (c != '\n');
            }
        }
        else
            skip = 0;
    }

    eline = line;
    ecolumn = column;

    t.id = c;
    t.line = line;
    t.column = column;

    if (c == '#' && prev == '\n' && isspace(l))
    {
        parse_pp_info();
        return get_token();
    }

    if (c == EOF)
    {
    }
    else if (isalpha(c) || c == '_')
    {
        char* p = t.string;
        int len = 1;
        t.id = IDENTIFIER;

        *p++ = c;
        while (isalnum(l) || l == '_')
        {
            readbyte();
            if (len < MAX_ID_LEN)
            {
                *p++ = c;
                ++len;
            }
        }
        *p = 0;

        if (len >= MAX_ID_LEN)
        {
            err(W, "too long identifier has been truncated to %d characters.",
                 MAX_ID_LEN);
        }

        if (strcmp(t.string, "byte") == 0)
            t.id = BYTE;
        else if (strcmp(t.string, "return") == 0)
            t.id = RETURN;
        else if (strcmp(t.string, "void") == 0)
            t.id = VOID;
        else if (strcmp(t.string, "word") == 0)
            t.id = WORD;
    }
    else if (isdigit(c))
    {
        t.id = CONSTANT;
        t._unsigned = 0;
        t._word = 0;
        parse_num();
    }
    else if ( c == '>')
    {
        if (l == '=')
        {
            readbyte();
            t.id = GE_OP;
        }
    }
    else if (c == '<')
    {
        if (l == '=')
        {
            readbyte();
            t.id = LE_OP;
        }
    }
    else if (c == '!')
    {
        if (l == '=')
        {
            readbyte();
            t.id = NE_OP;
        }
    }
    else if (c == '=')
    {
        if (l == '=')
        {
            readbyte();
            t.id = EQ_OP;
        }
    }
    else if (c == '-')
    {
    }
    else if (c == '+')
    {
    }
    else if (c == '*')
    {
    }
    else if (c == '/')
    {
    }
    else if (c == '%')
    {
    }
    else if (   c == '(' || c == ')'
             || c == '{' || c == '}'
             || c == '[' || c == ']'
             || c == ';' || c == ',')
    {
    }
    else
    {
        if (c < ' ' || c >= 127)
            err(E, "stray '%o' in program", c);
        else
            err(E, "stray \"%c\" in program", c);
        return get_token();
    }

    return &t;
}